

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

QLatin1StringView __thiscall
QMimeBinaryProvider::iconForMime
          (QMimeBinaryProvider *this,CacheFile *cacheFile,int posListOffset,QByteArray *inputMime)

{
  QLatin1StringView QVar1;
  quint32 qVar2;
  int iVar3;
  int iVar4;
  QLatin1String *this_00;
  CacheFile *in_RSI;
  long in_FS_OFFSET;
  int iconOffset;
  int cmp;
  char *mime;
  int mimeOffset;
  int off;
  int medium;
  int end;
  int begin;
  int numIcons;
  int iconsListOffset;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CacheFile *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int local_48;
  int local_44;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CacheFile::getUint32(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  qVar2 = CacheFile::getUint32(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  local_44 = 0;
  local_48 = qVar2 - 1;
LAB_008fc9b6:
  do {
    if (local_48 < local_44) {
      QLatin1String::QLatin1String(&local_18);
LAB_008fcaa1:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      QVar1.m_data = local_18.m_data;
      QVar1.m_size = local_18.m_size;
      return QVar1;
    }
    iVar3 = (local_44 + local_48) / 2;
    qVar2 = CacheFile::getUint32(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    this_00 = (QLatin1String *)CacheFile::getCharStar(in_RSI,qVar2);
    QByteArray::operator_cast_to_char_((QByteArray *)0x8fca25);
    iVar4 = qstrcmp((char *)in_stack_ffffffffffffff80,
                    (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar4 < 0) {
      local_44 = iVar3 + 1;
      goto LAB_008fc9b6;
    }
    if (iVar4 < 1) {
      qVar2 = CacheFile::getUint32(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      CacheFile::getCharStar(in_RSI,qVar2);
      QLatin1String::QLatin1String(this_00,in_stack_ffffffffffffff88);
      goto LAB_008fcaa1;
    }
    local_48 = iVar3 + -1;
  } while( true );
}

Assistant:

QLatin1StringView QMimeBinaryProvider::iconForMime(CacheFile *cacheFile, int posListOffset,
                                                   const QByteArray &inputMime)
{
    const int iconsListOffset = cacheFile->getUint32(posListOffset);
    const int numIcons = cacheFile->getUint32(iconsListOffset);
    int begin = 0;
    int end = numIcons - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = iconsListOffset + 4 + 8 * medium;
        const int mimeOffset = cacheFile->getUint32(off);
        const char *mime = cacheFile->getCharStar(mimeOffset);
        const int cmp = qstrcmp(mime, inputMime);
        if (cmp < 0)
            begin = medium + 1;
        else if (cmp > 0)
            end = medium - 1;
        else {
            const int iconOffset = cacheFile->getUint32(off + 4);
            return QLatin1StringView(cacheFile->getCharStar(iconOffset));
        }
    }
    return QLatin1StringView();
}